

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

CodeLocation * __thiscall
testing::internal::TypedTestSuitePState::GetCodeLocation
          (TypedTestSuitePState *this,string *test_name)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  GTestLog local_2c;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  string *test_name_local;
  TypedTestSuitePState *this_local;
  
  it._M_node = (_Base_ptr)test_name;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
       ::find(&this->registered_tests_,test_name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
       ::end(&this->registered_tests_);
  bVar1 = std::operator!=(&local_20,&local_28);
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_2c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O0/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x260);
    poVar2 = GTestLog::GetStream(&local_2c);
    std::operator<<(poVar2,"Condition it != registered_tests_.end() failed. ");
    GTestLog::~GTestLog(&local_2c);
  }
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>
           ::operator->(&local_20);
  return &ppVar3->second;
}

Assistant:

const CodeLocation& GetCodeLocation(const std::string& test_name) const {
    RegisteredTestsMap::const_iterator it = registered_tests_.find(test_name);
    GTEST_CHECK_(it != registered_tests_.end());
    return it->second;
  }